

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_sectors.cpp
# Opt level: O1

double __thiscall
sector_t::NextLowestFloorAt
          (sector_t *this,double x,double y,double z,int flags,double steph,sector_t **resultsec,
          F3DFloor **resultffloor)

{
  uint uVar1;
  F3DFloor *pFVar2;
  secplane_t *psVar3;
  ulong uVar4;
  subsector_t *psVar5;
  ulong uVar6;
  bool bVar7;
  bool bVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double in_XMM9_Qa;
  
  dVar11 = 3.4028234663852886e+38;
  do {
    uVar4 = (ulong)(this->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
    dVar10 = ((this->floorplane).normal.Y * y +
             (this->floorplane).normal.X * x + (this->floorplane).D) * (this->floorplane).negiC;
    bVar7 = uVar4 != 0;
    if (bVar7) {
      uVar6 = 1;
      do {
        pFVar2 = (this->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array[uVar6 - 1];
        bVar8 = true;
        if ((~pFVar2->flags & 3) == 0) {
          psVar3 = (pFVar2->top).plane;
          dVar9 = ((psVar3->normal).Y * y + (psVar3->normal).X * x + psVar3->D) * psVar3->negiC;
          if ((dVar10 < dVar9) &&
             ((dVar9 <= z ||
              (((dVar9 < steph + z && ((flags & 8U) == 0)) &&
               (psVar3 = (pFVar2->bottom).plane,
               ((psVar3->normal).Y * y + (psVar3->normal).X * x + psVar3->D) * psVar3->negiC < z))))
             )) {
            if (resultsec != (sector_t **)0x0) {
              *resultsec = this;
            }
            if (resultffloor != (F3DFloor **)0x0) {
              *resultffloor = pFVar2;
            }
            bVar8 = false;
            in_XMM9_Qa = dVar9;
          }
        }
        if (!bVar8) break;
        bVar7 = uVar6 < uVar4;
        bVar8 = uVar6 != uVar4;
        uVar6 = uVar6 + 1;
      } while (bVar8);
    }
    if (bVar7) {
      bVar7 = false;
      dVar10 = in_XMM9_Qa;
    }
    else {
      if (((flags & 0x10U) == 0) && ((this->planes[0].Flags & 0x1d0U) == 0x100)) {
        uVar1 = this->Portals[0];
        dVar9 = sectorPortals.Array[uVar1].mPlaneZ;
        if (dVar9 < dVar11) {
          x = x + sectorPortals.Array[uVar1].mDisplacement.X;
          y = y + sectorPortals.Array[uVar1].mDisplacement.Y;
          psVar5 = P_PointInSubsector(x,y);
          this = psVar5->sector;
          bVar7 = true;
          dVar11 = dVar9;
          dVar10 = in_XMM9_Qa;
          goto LAB_0053633b;
        }
      }
      if (resultffloor != (F3DFloor **)0x0) {
        *resultffloor = (F3DFloor *)0x0;
      }
      if (resultsec != (sector_t **)0x0) {
        *resultsec = this;
      }
      bVar7 = false;
    }
LAB_0053633b:
    in_XMM9_Qa = dVar10;
    if (!bVar7) {
      return dVar10;
    }
  } while( true );
}

Assistant:

double sector_t::NextLowestFloorAt(double x, double y, double z, int flags, double steph, sector_t **resultsec, F3DFloor **resultffloor)
{
	sector_t *sec = this;
	double planeheight = FLT_MAX;
	while (true)
	{
		// Looking through planes from top to bottom
		unsigned numff = sec->e->XFloor.ffloors.Size();
		double realfloor = sec->floorplane.ZatPoint(x, y);
		for (unsigned i = 0; i < numff; ++i)
		{
			F3DFloor *ff = sec->e->XFloor.ffloors[i];


			// either with feet above the 3D floor or feet with less than 'stepheight' map units inside
			if ((ff->flags & (FF_EXISTS | FF_SOLID)) == (FF_EXISTS | FF_SOLID))
			{
				double ffz = ff->top.plane->ZatPoint(x, y);
				double ffb = ff->bottom.plane->ZatPoint(x, y);

				if (ffz > realfloor && (z >= ffz || (!(flags & FFCF_3DRESTRICT) && (ffb < z && ffz < z + steph))))
				{ // This floor is beneath our feet.
					if (resultsec) *resultsec = sec;
					if (resultffloor) *resultffloor = ff;
					return ffz;
				}
			}
		}
		if ((flags & FFCF_NOPORTALS) || sec->PortalBlocksMovement(sector_t::floor) || planeheight <= sec->GetPortalPlaneZ(floor))
		{ // Use sector's floor
			if (resultffloor) *resultffloor = NULL;
			if (resultsec) *resultsec = sec;
			return realfloor;
		}
		else
		{
			DVector2 pos = sec->GetPortalDisplacement(floor);
			x += pos.X;
			y += pos.Y;
			planeheight = sec->GetPortalPlaneZ(floor);
			sec = P_PointInSector(x, y);
		}
	}
}